

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O0

void __thiscall
duckdb::Binder::AddUsingBindingSet
          (Binder *this,
          unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true> *set
          )

{
  Binder *pBVar1;
  unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true> *in_RSI;
  Binder *root_binder;
  Binder *in_stack_ffffffffffffffc0;
  BindContext *this_00;
  
  pBVar1 = GetRootBinder(in_stack_ffffffffffffffc0);
  this_00 = &pBVar1->bind_context;
  unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>::unique_ptr
            ((unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>
              *)this_00,in_RSI);
  BindContext::AddUsingBindingSet(this_00,in_RSI);
  unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>::~unique_ptr
            ((unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>
              *)0xe7b54f);
  return;
}

Assistant:

void Binder::AddUsingBindingSet(unique_ptr<UsingColumnSet> set) {
	auto &root_binder = GetRootBinder();
	root_binder.bind_context.AddUsingBindingSet(std::move(set));
}